

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Detail * __thiscall
Catch::Detail::rawMemoryToString_abi_cxx11_(Detail *this,void *object,size_t size)

{
  _Setfill<char> _Var1;
  Arch AVar2;
  _Setw _Var3;
  ostream *poVar4;
  ostringstream local_1b0 [8];
  ostringstream os;
  uchar *bytes;
  int local_28;
  int inc;
  int end;
  int i;
  size_t size_local;
  void *object_local;
  
  inc = 0;
  local_28 = (int)size;
  bytes._4_4_ = 1;
  AVar2 = anon_unknown_0::Endianness::which();
  if (AVar2 == Little) {
    inc = local_28 + -1;
    bytes._4_4_ = -1;
    local_28 = -1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar4 = std::operator<<((ostream *)local_1b0,"0x");
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  std::ostream::operator<<(poVar4,std::hex);
  for (; inc != local_28; inc = bytes._4_4_ + inc) {
    _Var3 = std::setw(2);
    poVar4 = std::operator<<((ostream *)local_1b0,_Var3);
    std::ostream::operator<<(poVar4,(uint)*(byte *)((long)object + (long)inc));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return this;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size )
    {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        std::ostringstream os;
        os << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             os << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return os.str();
    }